

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::Write(TPZSkylMatrix<double> *this,TPZStream *buf,int withclassid)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  TPZVec<long> skyl;
  TPZVec<long> TStack_38;
  long local_18;
  
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZStream::Write<double>(buf,&this->fStorage);
  local_18 = 0;
  TPZVec<long>::TPZVec
            (&TStack_38,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1,&local_18);
  pdVar4 = (double *)(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  pdVar2 = pdVar4;
  if (pdVar4 != (double *)0x0) {
    pdVar2 = (this->fStorage).fStore;
  }
  ppdVar1 = (this->fElem).fStore;
  for (lVar3 = 0; lVar3 <= (long)pdVar4; lVar3 = lVar3 + 1) {
    TStack_38.fStore[lVar3] = (long)ppdVar1[lVar3] - (long)pdVar2 >> 3;
    pdVar4 = (double *)(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  }
  TPZStream::Write<long>(buf,&TStack_38);
  TPZVec<long>::~TPZVec(&TStack_38);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const
{
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    for (int64_t i=0; i<this->Rows()+1; i++) {
        skyl[i] = fElem[i] - ptr;
    }
    buf.Write( skyl);
}